

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::blueprint_helpers::parseMeasurePerUnitOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  MeasureUnit *other;
  MeasureUnit numerator;
  MeasureUnit MStack_38;
  
  other = &macros->unit;
  MeasureUnit::MeasureUnit(&MStack_38,other);
  parseMeasureUnitOption(segment,macros,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    MeasureUnit::operator=(&macros->perUnit,other);
    MeasureUnit::operator=(other,&MStack_38);
  }
  MeasureUnit::~MeasureUnit(&MStack_38);
  return;
}

Assistant:

void blueprint_helpers::parseMeasurePerUnitOption(const StringSegment& segment, MacroProps& macros,
                                                  UErrorCode& status) {
    // A little bit of a hack: safe the current unit (numerator), call the main measure unit
    // parsing code, put back the numerator unit, and put the new unit into per-unit.
    MeasureUnit numerator = macros.unit;
    parseMeasureUnitOption(segment, macros, status);
    if (U_FAILURE(status)) { return; }
    macros.perUnit = macros.unit;
    macros.unit = numerator;
}